

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O0

void __thiscall ezexample::ezexample(ezexample *this,vw *this_vw,bool multiline,vw *this_vw_parser)

{
  example *peVar1;
  vw *in_RCX;
  byte in_DL;
  vw *in_RSI;
  ezexample *in_RDI;
  ezexample *in_stack_ffffffffffffffb0;
  example **ppeStack_48;
  example **local_40;
  example *in_stack_ffffffffffffffc8;
  vw *in_stack_ffffffffffffffd0;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11f003);
  setup_new_ezexample(in_RDI,in_RSI,(bool)(in_DL & 1),in_RCX);
  v_init<example*>();
  (in_RDI->example_copies).end_array = local_40;
  (in_RDI->example_copies).erase_count = (size_t)in_stack_ffffffffffffffc8;
  (in_RDI->example_copies)._begin = (example **)in_stack_ffffffffffffffb0;
  (in_RDI->example_copies)._end = ppeStack_48;
  peVar1 = get_new_example(in_stack_ffffffffffffffb0);
  in_RDI->ec = peVar1;
  in_RDI->we_create_ec = true;
  if ((in_RDI->vw_ref->add_constant & 1U) != 0) {
    VW::add_constant_feature(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

ezexample(vw* this_vw, bool multiline = false, vw* this_vw_parser = nullptr)
  {
    setup_new_ezexample(this_vw, multiline, this_vw_parser);
    example_copies = v_init<example*>();
    ec = get_new_example();
    we_create_ec = true;

    if (vw_ref->add_constant)
      VW::add_constant_feature(*vw_ref, ec);
  }